

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfgmr.c
# Opt level: O3

int sfgmr(int n,_func_void_float_float_ptr_float_float_ptr *smatvec,
         _func_void_int_float_ptr_float_ptr *spsolve,float *rhs,float *sol,double tol,int im,
         int *itmax,FILE *fits)

{
  double dVar1;
  long lVar2;
  real *prVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  float *pfVar7;
  void *addr;
  void *addr_00;
  int iVar8;
  long lVar9;
  double dVar10;
  long lVar11;
  size_t n_00;
  long *plVar12;
  int j;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  float *pfVar19;
  double dVar20;
  size_t n_01;
  real rVar21;
  float fVar22;
  float fVar23;
  float negt;
  int i_1;
  uint local_f4;
  double local_f0;
  ulong local_e8;
  float local_e0;
  real local_dc;
  ulong local_d8;
  void *local_d0;
  undefined1 local_c8 [16];
  ulong local_b0;
  float *local_a8;
  double local_a0;
  float *local_98;
  _func_void_float_float_ptr_float_float_ptr *local_90;
  long *local_88;
  long local_80;
  uint local_74;
  uint local_70;
  integer local_6c;
  ulong local_68;
  float *local_60;
  float *local_58;
  double local_50;
  float *local_48;
  _func_void_int_float_ptr_float_ptr *local_40;
  void *local_38;
  
  local_b0 = (ulong)(uint)*itmax;
  local_6c = 1;
  uVar13 = im + 1;
  local_f0 = (double)(long)(int)uVar13;
  local_f4 = n;
  local_a0 = tol;
  local_98 = rhs;
  local_90 = smatvec;
  local_60 = sol;
  local_40 = spsolve;
  local_88 = (long *)superlu_malloc((long)local_f0 * 8);
  local_d8 = (ulong)(uint)im;
  if (-1 < im) {
    uVar17 = 0;
    do {
      pfVar7 = floatMalloc((long)n);
      local_88[uVar17] = (long)pfVar7;
      uVar17 = uVar17 + 1;
    } while (uVar13 != uVar17);
  }
  uVar17 = local_d8;
  iVar6 = (int)local_d8;
  n_01 = (size_t)iVar6;
  local_74 = uVar13;
  addr = superlu_malloc(n_01 * 8);
  addr_00 = superlu_malloc(n_01 * 8);
  uVar17 = uVar17 & 0xffffffff;
  local_68 = uVar17;
  if (0 < iVar6) {
    n_00 = 2;
    do {
      pfVar7 = floatMalloc(n_00);
      *(float **)((long)addr_00 + n_00 * 8 + -0x10) = pfVar7;
      pfVar7 = floatMalloc((long)n);
      *(float **)((long)addr + n_00 * 8 + -0x10) = pfVar7;
      lVar9 = n_00 - uVar17;
      n_00 = n_00 + 1;
    } while (lVar9 != 1);
  }
  pfVar7 = floatMalloc(n_01);
  local_58 = floatMalloc(n_01);
  local_a8 = floatMalloc((size_t)local_f0);
  local_70 = (int)local_b0 + 10;
  local_e8 = 0;
  local_50 = 0.0;
  if (0 < (int)local_d8) {
    local_50 = (double)(local_d8 & 0xffffffff);
  }
  local_e0 = 0.0;
  plVar12 = local_88;
  pfVar19 = local_60;
  local_d0 = addr_00;
  local_48 = pfVar7;
  local_38 = addr;
  do {
    (*local_90)(1.0,pfVar19,0.0,(float *)*plVar12);
    prVar3 = (real *)*plVar12;
    if (0 < (long)(int)local_f4) {
      lVar9 = 0;
      do {
        prVar3[lVar9] = local_98[lVar9] - prVar3[lVar9];
        lVar9 = lVar9 + 1;
      } while ((int)local_f4 != lVar9);
    }
    rVar21 = snrm2_((integer *)&local_f4,prVar3,&local_6c);
    local_c8._0_4_ = rVar21;
    local_f0 = (double)rVar21;
    if ((fits != (FILE *)0x0) && ((int)local_e8 == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",local_f0,0);
    }
    rVar21 = snrm2_((integer *)&local_f4,local_98,&local_6c);
    uVar17 = local_e8;
    if (local_f0 <= (double)rVar21 * local_a0) goto LAB_001029aa;
    if (0 < (long)(int)local_f4) {
      lVar9 = *plVar12;
      lVar11 = 0;
      do {
        *(float *)(lVar9 + lVar11 * 4) =
             *(float *)(lVar9 + lVar11 * 4) * (1.0 / (float)local_c8._0_4_);
        lVar11 = lVar11 + 1;
      } while ((int)local_f4 != lVar11);
    }
    if ((int)local_e8 == 0) {
      local_e0 = (float)(local_f0 * local_a0);
    }
    *local_a8 = (float)local_c8._0_4_;
    lVar9 = 1;
    dVar10 = 0.0;
    do {
      if (dVar10 == local_50) {
        dVar20 = (double)((ulong)local_50 & 0xffffffff);
        break;
      }
      local_80 = lVar9;
      if (local_40 == (_func_void_int_float_ptr_float_ptr *)0x0) {
        scopy_((integer *)&local_f4,(real *)plVar12[(long)dVar10],&local_6c,
               *(real **)((long)addr + (long)dVar10 * 8),&local_6c);
      }
      else {
        (*local_40)(local_f4,*(float **)((long)addr + (long)dVar10 * 8),
                    (float *)plVar12[(long)dVar10]);
      }
      local_e8 = (ulong)((int)local_e8 + 1);
      dVar1 = (double)((long)dVar10 + 1);
      (*local_90)(1.0,*(float **)((long)addr + (long)dVar10 * 8),0.0,(float *)plVar12[(long)dVar1]);
      rVar21 = snrm2_((integer *)&local_f4,(real *)plVar12[(long)dVar1],&local_6c);
      lVar9 = local_80;
      local_c8._0_4_ = rVar21;
      lVar11 = 0;
      local_f0 = dVar10;
      do {
        local_dc = sdot_((integer *)&local_f4,(real *)plVar12[lVar11],&local_6c,
                         (real *)plVar12[(long)dVar1],&local_6c);
        *(real *)(*(long *)((long)local_d0 + (long)local_f0 * 8) + lVar11 * 4) = local_dc;
        local_dc = -local_dc;
        saxpy_((integer *)&local_f4,&local_dc,(real *)plVar12[lVar11],&local_6c,
               (real *)plVar12[(long)dVar1],&local_6c);
        lVar11 = lVar11 + 1;
      } while (lVar9 != lVar11);
      rVar21 = snrm2_((integer *)&local_f4,(real *)plVar12[(long)dVar1],&local_6c);
      if (rVar21 < (float)local_c8._0_4_ * 0.5) {
        do {
          lVar9 = local_80;
          plVar12 = local_88;
          local_c8._0_4_ = rVar21;
          lVar11 = 0;
          do {
            local_dc = sdot_((integer *)&local_f4,(real *)plVar12[lVar11],&local_6c,
                             (real *)plVar12[(long)dVar1],&local_6c);
            lVar16 = *(long *)((long)local_d0 + (long)local_f0 * 8);
            *(float *)(lVar16 + lVar11 * 4) = *(float *)(lVar16 + lVar11 * 4) + local_dc;
            local_dc = -local_dc;
            saxpy_((integer *)&local_f4,&local_dc,(real *)plVar12[lVar11],&local_6c,
                   (real *)plVar12[(long)dVar1],&local_6c);
            lVar11 = lVar11 + 1;
          } while (lVar9 != lVar11);
          rVar21 = snrm2_((integer *)&local_f4,(real *)plVar12[(long)dVar1],&local_6c);
        } while (rVar21 < (float)local_c8._0_4_ * 0.5);
      }
      addr = local_38;
      pfVar7 = local_48;
      plVar12 = local_88;
      dVar20 = local_f0;
      pfVar19 = *(float **)((long)local_d0 + (long)local_f0 * 8);
      pfVar19[(long)dVar1] = rVar21;
      if (((rVar21 != 0.0) || (NAN(rVar21))) && (0 < (long)(int)local_f4)) {
        lVar9 = local_88[(long)dVar1];
        lVar11 = 0;
        do {
          *(float *)(lVar9 + lVar11 * 4) = *(float *)(lVar9 + lVar11 * 4) * (1.0 / rVar21);
          lVar11 = lVar11 + 1;
        } while ((int)local_f4 != lVar11);
      }
      if (local_f0 != 0.0) {
        fVar23 = *pfVar19;
        dVar10 = 0.0;
        do {
          pfVar19[(long)dVar10] =
               local_48[(long)dVar10] * fVar23 + local_58[(long)dVar10] * pfVar19[(long)dVar10 + 1];
          fVar23 = pfVar19[(long)dVar10 + 1] * local_48[(long)dVar10] -
                   fVar23 * local_58[(long)dVar10];
          pfVar19[(long)dVar10 + 1] = fVar23;
          dVar10 = (double)((long)dVar10 + 1);
        } while (local_f0 != dVar10);
      }
      fVar23 = (float)*(undefined8 *)(pfVar19 + (long)local_f0);
      fVar22 = (float)((ulong)*(undefined8 *)(pfVar19 + (long)local_f0) >> 0x20);
      fVar22 = SQRT(fVar22 * fVar22 + fVar23 * fVar23);
      if ((fVar22 != 0.0) || (NAN(fVar22))) {
        local_48[(long)local_f0] = fVar23 / fVar22;
        fVar22 = pfVar19[(long)dVar1] / fVar22;
      }
      else {
        local_48[(long)local_f0] = 1.0;
        fVar22 = 0.0;
      }
      local_58[(long)local_f0] = fVar22;
      fVar23 = local_a8[(long)local_f0];
      local_a8[(long)dVar1] = -fVar22 * fVar23;
      local_a8[(long)local_f0] = fVar23 * local_48[(long)local_f0];
      pfVar19[(long)local_f0] =
           local_48[(long)local_f0] * pfVar19[(long)local_f0] +
           local_58[(long)local_f0] * pfVar19[(long)dVar1];
      fVar23 = ABS(local_a8[(long)dVar1]);
      if (fits != (FILE *)0x0) {
        local_c8 = ZEXT416((uint)fVar23);
        fprintf((FILE *)fits,"%8d   %10.2e\n",(double)fVar23,local_e8);
        fVar23 = (float)local_c8._0_4_;
      }
      if (fVar23 <= local_e0) break;
      lVar9 = local_80 + 1;
      dVar10 = dVar1;
    } while ((int)local_e8 < (int)local_b0);
    pfVar19 = local_60;
    addr_00 = local_d0;
    iVar18 = SUB84(dVar20,0);
    iVar8 = iVar18 - (uint)(iVar18 == (int)local_d8);
    iVar6 = -(uint)(iVar18 == (int)local_d8);
    local_c8._0_4_ = iVar8;
    lVar9 = (long)iVar8;
    local_a8[lVar9] =
         local_a8[lVar9] / *(float *)(*(long *)((long)local_d0 + lVar9 * 8) + lVar9 * 4);
    if (0 < iVar8) {
      lVar11 = ((ulong)dVar20 & 0xffffffff) + ~(ulong)(iVar18 == (int)local_d8);
      uVar17 = 1;
      do {
        lVar15 = lVar9 - uVar17;
        fVar23 = local_a8[lVar15];
        lVar16 = lVar11;
        do {
          lVar2 = lVar16 * 8;
          lVar5 = lVar16 + 1;
          lVar16 = lVar16 + 1;
          fVar23 = fVar23 - *(float *)(*(long *)((long)local_d0 + lVar2 + 8) + lVar15 * 4) *
                            local_a8[lVar5];
        } while (lVar16 < lVar9);
        local_a8[lVar15] = fVar23 / *(float *)(*(long *)((long)local_d0 + lVar15 * 8) + lVar15 * 4);
        uVar17 = uVar17 + 1;
        lVar11 = lVar11 + -1;
      } while (uVar17 != iVar18 + iVar6 + 1);
    }
    if (-1 < iVar8) {
      uVar17 = 0;
      do {
        if (0 < (int)local_f4) {
          fVar23 = local_a8[uVar17];
          lVar9 = *(long *)((long)addr + uVar17 * 8);
          uVar14 = 0;
          do {
            local_60[uVar14] = *(float *)(lVar9 + uVar14 * 4) * fVar23 + local_60[uVar14];
            uVar14 = uVar14 + 1;
          } while (local_f4 != uVar14);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != iVar6 + iVar18 + 1);
    }
    local_f0 = dVar20;
    (*local_90)(1.0,local_60,0.0,(float *)*plVar12);
    prVar3 = (real *)*plVar12;
    if (0 < (long)(int)local_f4) {
      lVar9 = 0;
      do {
        prVar3[lVar9] = local_98[lVar9] - prVar3[lVar9];
        lVar9 = lVar9 + 1;
      } while ((int)local_f4 != lVar9);
    }
    rVar21 = snrm2_((integer *)&local_f4,prVar3,&local_6c);
    uVar17 = local_e8 & 0xffffffff;
    if ((double)local_e0 / local_a0 <= (double)rVar21) {
      uVar17 = (ulong)local_70;
LAB_001029aa:
      local_e8 = uVar17;
      if ((int)local_d8 < 0) {
        superlu_free(plVar12);
      }
      else {
        uVar17 = (ulong)local_74;
        uVar14 = 0;
        do {
          superlu_free((void *)plVar12[uVar14]);
          uVar14 = uVar14 + 1;
        } while (uVar17 != uVar14);
        superlu_free(plVar12);
        uVar17 = local_68;
        if (0 < (int)local_d8) {
          uVar14 = 0;
          do {
            superlu_free(*(void **)((long)addr_00 + uVar14 * 8));
            superlu_free(*(void **)((long)addr + uVar14 * 8));
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
        }
      }
      iVar6 = (int)local_e8;
      bVar4 = (int)local_b0 <= iVar6;
      superlu_free(addr_00);
      superlu_free(addr);
      superlu_free(pfVar7);
      superlu_free(local_58);
      superlu_free(local_a8);
      *itmax = iVar6;
      return (int)bVar4;
    }
    if ((rVar21 <= local_e0) || (iVar6 = (int)local_e8, local_e8 = uVar17, (int)local_b0 <= iVar6))
    goto LAB_001029aa;
  } while( true );
}

Assistant:

int sfgmr(int n,
     void (*smatvec) (float, float[], float, float[]),
     void (*spsolve) (int, float[], float[]),
     float *rhs, float *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    float eps1 = 0.0;
    float **hh, *c, *s, *rs;
    float **vv, **z;
    float zero = 0.0;
    float one = 1.0;

    its = 0;
    vv = (float **)SUPERLU_MALLOC((im + 1) * sizeof(float *));
    for (int i = 0; i <= im; i++) vv[i] = floatMalloc(n);
    z = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    hh = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = floatMalloc(i + 2);
	z[i] = floatMalloc(n);
    }
    c = floatMalloc(im);
    s = floatMalloc(im);
    rs = floatMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */
	float beta = snrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * snrm2_(&n, rhs, &i_1)) )
	    break;
	float t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    vv[0][j] = vv[0][j] * t;
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0] = beta;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (spsolve)
		spsolve(n, z[i], vv[i]);
	    else
		scopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    smatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    float t0 = snrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		float negt;
		float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		hh[i][j] = tt;
		negt = -tt;
		saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = snrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    float negt;
		    float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		    hh[i][j] += tt;
		    negt = -tt;
		    saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = snrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1] = t;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
		    vv[i1][k] = vv[i1][k] * t;
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		float tt = hh[i][k1];
		hh[i][k1] = c[k1] * tt + s[k1] * hh[i][k];
		hh[i][k] = -s[k1] * tt + c[k1] * hh[i][k];
	    }

	    float gam = sqrt(pow(hh[i][i], 2) + pow(hh[i][i1], 2));

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
		c[i] = hh[i][i] / gam;
		s[i] = hh[i][i1] / gam;
	    }

	    rs[i1] = -s[i] * rs[i];
	    rs[i] = c[i] * rs[i];

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
	    hh[i][i] = c[i] * hh[i][i] + s[i] * hh[i][i1];
	    beta = fabs(rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	rs[i] = rs[i] / hh[i][i];

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    float tt = rs[k];
	    for (int j = k + 1; j <= i; j++)
		tt = tt - hh[j][k] * rs[j];
	    rs[k] = tt / hh[k][k];
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    float tt = rs[j];
	    for (int k = 0; k < n; k++)
		sol[k] += tt * z[j][k];
	}

	/* calculate the residual and output */
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = snrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}